

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-math.h
# Opt level: O0

RunResult wabt::interp::IntDiv<int>(int lhs,int rhs,int *out,string *out_msg)

{
  bool bVar1;
  string *out_msg_local;
  int *out_local;
  int rhs_local;
  int lhs_local;
  
  if (rhs == 0) {
    std::__cxx11::string::operator=((string *)out_msg,"integer divide by zero");
    rhs_local = 2;
  }
  else {
    bVar1 = IsNormalDivRem<int,_0>(lhs,rhs);
    if (bVar1) {
      *out = lhs / rhs;
      rhs_local = 0;
    }
    else {
      std::__cxx11::string::operator=((string *)out_msg,"integer overflow");
      rhs_local = 2;
    }
  }
  return rhs_local;
}

Assistant:

RunResult WABT_VECTORCALL IntDiv(T lhs, T rhs, T* out, std::string* out_msg) {
  if (WABT_UNLIKELY(rhs == 0)) {
    *out_msg = "integer divide by zero";
    return RunResult::Trap;
  }
  if (WABT_LIKELY(IsNormalDivRem(lhs, rhs))) {
    *out = lhs / rhs;
    return RunResult::Ok;
  } else {
    *out_msg = "integer overflow";
    return RunResult::Trap;
  }
}